

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

DSA_SIG * DSA_SIG_parse(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_30 [8];
  CBS child;
  DSA_SIG *ret;
  CBS *cbs_local;
  
  child.len = (size_t)DSA_SIG_new();
  if ((DSA_SIG *)child.len != (DSA_SIG *)0x0) {
    iVar1 = CBS_get_asn1(cbs,(CBS *)local_30,0x20000010);
    if ((((iVar1 != 0) && (iVar1 = parse_integer((CBS *)local_30,(BIGNUM **)child.len), iVar1 != 0))
        && (iVar1 = parse_integer((CBS *)local_30,(BIGNUM **)(child.len + 8)), iVar1 != 0)) &&
       (sVar2 = CBS_len((CBS *)local_30), sVar2 == 0)) {
      return (DSA_SIG *)child.len;
    }
    ERR_put_error(10,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,0x77);
    DSA_SIG_free((DSA_SIG *)child.len);
  }
  return (DSA_SIG *)0x0;
}

Assistant:

DSA_SIG *DSA_SIG_parse(CBS *cbs) {
  DSA_SIG *ret = DSA_SIG_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->r) ||
      !parse_integer(&child, &ret->s) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    DSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}